

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O0

State * __thiscall
Problem::getStateFromBidNumbers
          (State *__return_storage_ptr__,Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  int iVar1;
  double dVar2;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_60;
  int local_44;
  undefined1 local_40 [4];
  int totalConflicts;
  double local_28;
  double totalCost;
  vector<int,_std::allocator<int>_> *bidNos_local;
  Problem *this_local;
  
  totalCost = (double)bidNos;
  bidNos_local = (vector<int,_std::allocator<int>_> *)this;
  this_local = (Problem *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_40,bidNos);
  dVar2 = getStateCost(this,(vector<int,_std::allocator<int>_> *)local_40);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  local_28 = dVar2;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,bidNos);
  iVar1 = getStateConflicts(this,&local_60);
  std::vector<int,_std::allocator<int>_>::~vector(&local_60);
  local_44 = iVar1;
  std::vector<int,_std::allocator<int>_>::vector(&local_88,bidNos);
  State::State(__return_storage_ptr__,&local_88,local_28,local_44);
  std::vector<int,_std::allocator<int>_>::~vector(&local_88);
  return __return_storage_ptr__;
}

Assistant:

State Problem::getStateFromBidNumbers(vector<int> bidNos) {
    // cout<<"Getting state"<<endl;
    double totalCost = getStateCost(bidNos);
    // cout<<"Cost: "<<to_string(totalCost)<<", ";
    int totalConflicts = getStateConflicts(bidNos);
    // cout<<"Conflicts: "<<totalConflicts<<endl;
    return State(bidNos, totalCost, totalConflicts);
}